

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_opt.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  unsigned_long uVar2;
  byte bVar3;
  pointer puVar4;
  _Manager_type p_Var5;
  bool bVar6;
  int iVar7;
  DatabaseInterface *resolver;
  DatabaseInterface *iface;
  long lVar8;
  pointer puVar9;
  bool optimize_size;
  size_t hash_count;
  StateReplayer replayer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> state_json;
  size_t state_json_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  string output_db_path;
  string input_db_path;
  CLICallbacks cbs;
  CLIParser parser;
  undefined1 local_271;
  undefined8 local_270;
  allocator_type local_261;
  size_type local_260;
  long local_258;
  StateReplayer local_250;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_248;
  DatabaseInterface *local_230;
  size_type local_228;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_220;
  char *local_208;
  long local_200;
  char local_1f8;
  undefined7 uStack_1f7;
  char *local_1e8;
  long local_1e0;
  char local_1d8;
  undefined7 uStack_1d7;
  StateCreatorInterface local_1c8;
  StateRecorder local_1c0;
  undefined1 local_1b8;
  CLICallbacks local_1b0;
  _Any_data local_138;
  _Manager_type local_128;
  _Invoker_type local_120;
  _Any_data local_100;
  code *local_f0;
  _Any_data local_e0;
  code *local_d0;
  char local_b0;
  CLICallbacks local_a8;
  
  local_1e8 = &local_1d8;
  local_1e0 = 0;
  local_1d8 = '\0';
  local_208 = &local_1f8;
  local_200 = 0;
  local_1f8 = '\0';
  local_1b0.callbacks._M_h._M_buckets = &local_1b0.callbacks._M_h._M_single_bucket;
  local_1b0.callbacks._M_h._M_bucket_count = 1;
  local_1b0.callbacks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1b0.callbacks._M_h._M_element_count = 0;
  local_1b0.callbacks._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_1b0.callbacks._M_h._M_rehash_policy._M_next_resize = 0;
  local_1b0.callbacks._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_1b0.error_handler.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_1b0.error_handler.super__Function_base._M_functor._8_8_ = 0;
  local_1b0.error_handler.super__Function_base._M_manager = (_Manager_type)0x0;
  local_1b0.error_handler._M_invoker = (_Invoker_type)0x0;
  local_1b0.default_handler.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_1b0.default_handler.super__Function_base._M_functor._8_8_ = 0;
  local_1b0.default_handler.super__Function_base._M_manager = (_Manager_type)0x0;
  local_1b0.default_handler._M_invoker = (_Invoker_type)0x0;
  local_271 = 0;
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = 0;
  local_120 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_opt.cpp:136:20)>
              ::_M_invoke;
  local_128 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_opt.cpp:136:20)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_1b0,"--help",(function<void_(Fossilize::CLIParser_&)> *)&local_138);
  if (local_128 != (code *)0x0) {
    (*local_128)(&local_138,&local_138,3);
  }
  local_138._8_8_ = 0;
  local_138._M_unused._M_object = &local_1e8;
  local_120 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_opt.cpp:137:24)>
              ::_M_invoke;
  local_128 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_opt.cpp:137:24)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_1b0,"--input-db",(function<void_(Fossilize::CLIParser_&)> *)&local_138);
  if (local_128 != (code *)0x0) {
    (*local_128)(&local_138,&local_138,3);
  }
  local_138._8_8_ = 0;
  local_138._M_unused._M_object = &local_208;
  local_120 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_opt.cpp:138:25)>
              ::_M_invoke;
  local_128 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_opt.cpp:138:25)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_1b0,"--output-db",(function<void_(Fossilize::CLIParser_&)> *)&local_138);
  if (local_128 != (code *)0x0) {
    (*local_128)(&local_138,&local_138,3);
  }
  local_138._8_8_ = 0;
  local_138._M_unused._M_object = &local_271;
  local_120 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_opt.cpp:139:29)>
              ::_M_invoke;
  local_128 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_opt.cpp:139:29)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_1b0,"--optimize-size",(function<void_(Fossilize::CLIParser_&)> *)&local_138);
  if (local_128 != (code *)0x0) {
    (*local_128)(&local_138,&local_138,3);
  }
  p_Var5 = local_1b0.error_handler.super__Function_base._M_manager;
  local_138._M_unused._M_object =
       local_1b0.error_handler.super__Function_base._M_functor._M_unused._M_object;
  local_138._8_8_ = local_1b0.error_handler.super__Function_base._M_functor._8_8_;
  local_1b0.error_handler.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_1b0.error_handler.super__Function_base._M_functor._8_8_ = 0;
  local_128 = local_1b0.error_handler.super__Function_base._M_manager;
  local_1b0.error_handler.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_opt.cpp:140:22)>
       ::_M_manager;
  local_120 = local_1b0.error_handler._M_invoker;
  local_1b0.error_handler._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_opt.cpp:140:22)>
       ::_M_invoke;
  if (p_Var5 != (_Manager_type)0x0) {
    (*p_Var5)(&local_138,&local_138,__destroy_functor);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&local_a8,&local_1b0,&local_1b0);
  local_a8.error_handler.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_a8.error_handler.super__Function_base._M_functor._8_8_ = 0;
  local_a8.error_handler.super__Function_base._M_manager = (_Manager_type)0x0;
  local_a8.error_handler._M_invoker = local_1b0.error_handler._M_invoker;
  if (local_1b0.error_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    local_a8.error_handler.super__Function_base._M_functor._M_unused._M_object =
         local_1b0.error_handler.super__Function_base._M_functor._M_unused._M_object;
    local_a8.error_handler.super__Function_base._M_functor._8_8_ =
         local_1b0.error_handler.super__Function_base._M_functor._8_8_;
    local_a8.error_handler.super__Function_base._M_manager =
         local_1b0.error_handler.super__Function_base._M_manager;
    local_1b0.error_handler.super__Function_base._M_manager = (_Manager_type)0x0;
    local_1b0.error_handler._M_invoker = (_Invoker_type)0x0;
  }
  local_a8.default_handler.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_a8.default_handler.super__Function_base._M_functor._8_8_ = 0;
  local_a8.default_handler.super__Function_base._M_manager = (_Manager_type)0x0;
  local_a8.default_handler._M_invoker = local_1b0.default_handler._M_invoker;
  if (local_1b0.default_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    local_a8.default_handler.super__Function_base._M_functor._M_unused._M_object =
         local_1b0.default_handler.super__Function_base._M_functor._M_unused._M_object;
    local_a8.default_handler.super__Function_base._M_functor._8_8_ =
         local_1b0.default_handler.super__Function_base._M_functor._8_8_;
    local_a8.default_handler.super__Function_base._M_manager =
         local_1b0.default_handler.super__Function_base._M_manager;
    local_1b0.default_handler.super__Function_base._M_manager = (_Manager_type)0x0;
    local_1b0.default_handler._M_invoker = (_Invoker_type)0x0;
  }
  Fossilize::CLIParser::CLIParser((CLIParser *)&local_138,&local_a8,argc + -1,argv + 1);
  if (local_a8.default_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a8.default_handler.super__Function_base._M_manager)
              ((_Any_data *)&local_a8.default_handler,(_Any_data *)&local_a8.default_handler,
               __destroy_functor);
  }
  if (local_a8.error_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a8.error_handler.super__Function_base._M_manager)
              ((_Any_data *)&local_a8.error_handler,(_Any_data *)&local_a8.error_handler,
               __destroy_functor);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_a8);
  bVar6 = Fossilize::CLIParser::parse((CLIParser *)&local_138);
  iVar7 = 1;
  if ((bVar6) && (iVar7 = 0, local_b0 == '\0')) {
    if (local_1e0 == 0) {
      main_cold_8();
    }
    else {
      if (local_200 != 0) {
        local_270 = 1;
        resolver = Fossilize::create_database(local_1e8,ReadOnly);
        iface = Fossilize::create_database(local_208,OverWrite);
        local_1c8._vptr_StateCreatorInterface = (_func_int **)&PTR__OptimizeReplayer_003d76d0;
        Fossilize::StateRecorder::StateRecorder(&local_1c0);
        local_1b8 = local_271;
        Fossilize::StateReplayer::StateReplayer(&local_250);
        Fossilize::StateRecorder::set_database_enable_checksum(&local_1c0,true);
        Fossilize::StateRecorder::set_database_enable_compression(&local_1c0,true);
        if ((resolver == (DatabaseInterface *)0x0) ||
           (iVar7 = (*resolver->_vptr_DatabaseInterface[2])(resolver), (char)iVar7 == '\0')) {
          main_cold_6();
        }
        else if (iface == (DatabaseInterface *)0x0) {
          main_cold_5();
          local_270 = 1;
        }
        else {
          local_230 = iface;
          Fossilize::StateRecorder::init_recording_thread(&local_1c0,iface);
          local_248.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_248.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_248.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_270 = 0;
          lVar8 = 0;
          do {
            local_260 = 0;
            uVar1 = *(uint *)((long)main::playback_order + lVar8);
            iVar7 = (*resolver->_vptr_DatabaseInterface[6])(resolver,(ulong)uVar1,&local_260,0);
            if ((char)iVar7 == '\0') {
              main_cold_1();
              local_270 = 1;
              break;
            }
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      (&local_220,local_260,&local_261);
            iVar7 = (*resolver->_vptr_DatabaseInterface[6])(resolver,(ulong)uVar1,&local_260);
            puVar4 = local_220.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            if ((char)iVar7 == '\0') {
              main_cold_2();
              local_270 = 1;
              bVar3 = 1;
            }
            else {
              puVar9 = local_220.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              local_258 = lVar8;
              if (local_220.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start ==
                  local_220.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                bVar3 = 0;
              }
              else {
                do {
                  uVar2 = *puVar9;
                  iVar7 = (*resolver->_vptr_DatabaseInterface[3])
                                    (resolver,(ulong)uVar1,uVar2,&local_228,0,0);
                  if ((char)iVar7 == '\0') {
LAB_0014a509:
                    main_cold_3();
                    local_270 = 1;
                    bVar3 = 1;
                    lVar8 = local_258;
                    goto LAB_0014a4dc;
                  }
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_248,local_228);
                  iVar7 = (*resolver->_vptr_DatabaseInterface[3])(resolver,(ulong)uVar1,uVar2);
                  if ((char)iVar7 == '\0') goto LAB_0014a509;
                  bVar6 = Fossilize::StateReplayer::parse
                                    (&local_250,&local_1c8,resolver,
                                     local_248.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                                     (long)local_248.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_248.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
                  if (!bVar6) {
                    main_cold_4();
                  }
                  puVar9 = puVar9 + 1;
                } while (puVar9 != puVar4);
                bVar3 = 0;
                lVar8 = local_258;
              }
            }
LAB_0014a4dc:
            if (local_220.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_220.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_220.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_220.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            lVar8 = lVar8 + 4;
          } while (!(bool)(bVar3 | lVar8 == 0x1c));
          iface = local_230;
          if (local_248.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_248.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_248.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_248.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
            iface = local_230;
          }
        }
        Fossilize::StateReplayer::~StateReplayer(&local_250);
        local_1c8._vptr_StateCreatorInterface = (_func_int **)&PTR__OptimizeReplayer_003d76d0;
        Fossilize::StateRecorder::~StateRecorder(&local_1c0);
        if (iface != (DatabaseInterface *)0x0) {
          (*iface->_vptr_DatabaseInterface[1])(iface);
        }
        if (resolver != (DatabaseInterface *)0x0) {
          (*resolver->_vptr_DatabaseInterface[1])(resolver);
        }
        iVar7 = (int)local_270;
        goto LAB_0014a5e7;
      }
      main_cold_7();
    }
    iVar7 = 1;
  }
LAB_0014a5e7:
  if (local_d0 != (code *)0x0) {
    (*local_d0)(&local_e0,&local_e0,__destroy_functor);
  }
  if (local_f0 != (code *)0x0) {
    (*local_f0)(&local_100,&local_100,__destroy_functor);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_138);
  if (local_1b0.default_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1b0.default_handler.super__Function_base._M_manager)
              ((_Any_data *)&local_1b0.default_handler,(_Any_data *)&local_1b0.default_handler,
               __destroy_functor);
  }
  if (local_1b0.error_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1b0.error_handler.super__Function_base._M_manager)
              ((_Any_data *)&local_1b0.error_handler,(_Any_data *)&local_1b0.error_handler,
               __destroy_functor);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_1b0);
  if (local_208 != &local_1f8) {
    operator_delete(local_208,CONCAT71(uStack_1f7,local_1f8) + 1);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,CONCAT71(uStack_1d7,local_1d8) + 1);
  }
  return iVar7;
}

Assistant:

int main(int argc, char *argv[])
{
	string input_db_path;
	string output_db_path;
	CLICallbacks cbs;
	bool optimize_size = false;

	cbs.add("--help", [](CLIParser &parser) { print_help(); parser.end(); });
	cbs.add("--input-db", [&](CLIParser &parser) { input_db_path = parser.next_string(); });
	cbs.add("--output-db", [&](CLIParser &parser) { output_db_path = parser.next_string(); });
	cbs.add("--optimize-size", [&](CLIParser &) { optimize_size = true; });
	cbs.error_handler = [] { print_help(); };

	CLIParser parser(move(cbs), argc - 1, argv + 1);
	if (!parser.parse())
		return EXIT_FAILURE;
	if (parser.is_ended_state())
		return EXIT_SUCCESS;

	if (input_db_path.empty())
	{
		LOGE("No input database provided.\n");
		print_help();
		return EXIT_FAILURE;
	}

	if (output_db_path.empty())
	{
		LOGE("No output database provided.\n");
		print_help();
		return EXIT_FAILURE;
	}

	auto input_db = std::unique_ptr<DatabaseInterface>(create_database(input_db_path.c_str(), DatabaseMode::ReadOnly));
	auto output_db = std::unique_ptr<DatabaseInterface>(create_database(output_db_path.c_str(), DatabaseMode::OverWrite));

	OptimizeReplayer optimize_replayer;
	optimize_replayer.optimize_size = optimize_size;

	StateReplayer replayer;
	optimize_replayer.recorder.set_database_enable_checksum(true);
	optimize_replayer.recorder.set_database_enable_compression(true);

	if (!input_db || !input_db->prepare())
	{
		LOGE("Failed to load database: %s\n", argv[1]);
		return EXIT_FAILURE;
	}

	if (!output_db)
	{
		LOGE("Failed to open database for writing: %s\n", argv[2]);
		return EXIT_FAILURE;
	}

	// Recording thread prepares.
	optimize_replayer.recorder.init_recording_thread(output_db.get());

	static const ResourceTag playback_order[] = {
		RESOURCE_SHADER_MODULE,
		RESOURCE_SAMPLER,
		RESOURCE_DESCRIPTOR_SET_LAYOUT,
		RESOURCE_PIPELINE_LAYOUT,
		RESOURCE_RENDER_PASS,
		RESOURCE_GRAPHICS_PIPELINE,
		RESOURCE_COMPUTE_PIPELINE,
	};

	vector<uint8_t> state_json;
	for (auto &tag : playback_order)
	{
		size_t hash_count = 0;
		if (!input_db->get_hash_list_for_resource_tag(tag, &hash_count, nullptr))
		{
			LOGE("Failed to get hashes.\n");
			return EXIT_FAILURE;
		}

		vector<Hash> hashes(hash_count);

		if (!input_db->get_hash_list_for_resource_tag(tag, &hash_count, hashes.data()))
		{
			LOGE("Failed to get shader module hashes.\n");
			return EXIT_FAILURE;
		}

		for (auto hash : hashes)
		{
			size_t state_json_size;
			if (!input_db->read_entry(tag, hash, &state_json_size, nullptr, 0))
			{
				LOGE("Failed to load blob from cache.\n");
				return EXIT_FAILURE;
			}

			state_json.resize(state_json_size);

			if (!input_db->read_entry(tag, hash, &state_json_size, state_json.data(), 0))
			{
				LOGE("Failed to load blob from cache.\n");
				return EXIT_FAILURE;
			}

			if (!replayer.parse(optimize_replayer, input_db.get(), state_json.data(), state_json.size()))
				LOGE("Failed to parse blob (tag: %d, hash: 0x%" PRIx64 ").\n", tag, hash);
		}
	}
}